

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_and_relation.cpp
# Opt level: O2

int formore(void)

{
  int i;
  long lVar1;
  ostream *poVar2;
  int i_1;
  longlong factorials [16];
  
  factorials[0] = 1;
  factorials[1] = 1;
  for (lVar1 = 2; lVar1 != 0x10; lVar1 = lVar1 + 1) {
    factorials[lVar1] = factorials[lVar1 + -1] * lVar1;
  }
  poVar2 = (ostream *)std::ostream::operator<<(&std::cout,0);
  std::operator<<(poVar2,"! = ");
}

Assistant:

int formore () {
    long long factorials[ArSize];
    factorials[1] = factorials[0] = 1LL;

    for (int i = 2; i < ArSize; i++) {
        factorials[i] = i * factorials[i - 1];
    }

    for (int i = 0; i < ArSize; i++) {
        std::cout << i << "! = " << factorials[i] << std::endl;
    }

    return 0;
}